

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

find_escape_result<char> * __thiscall
fmt::v10::detail::find_escape
          (find_escape_result<char> *__return_storage_ptr__,detail *this,char *begin,char *end)

{
  string_view s;
  
  __return_storage_ptr__->begin = begin;
  __return_storage_ptr__->end = (char *)0x0;
  __return_storage_ptr__->cp = 0;
  s.size_ = (size_t)__return_storage_ptr__;
  s.data_ = begin + -(long)this;
  for_each_codepoint<fmt::v10::detail::find_escape(char_const*,char_const*)::_lambda(unsigned_int,fmt::v10::basic_string_view<char>)_1_>
            (this,s,(anon_class_8_1_6971b95b_for_f)end);
  return __return_storage_ptr__;
}

Assistant:

inline auto find_escape(const char* begin, const char* end)
    -> find_escape_result<char> {
  if (!is_utf8()) return find_escape<char>(begin, end);
  auto result = find_escape_result<char>{end, nullptr, 0};
  for_each_codepoint(string_view(begin, to_unsigned(end - begin)),
                     [&](uint32_t cp, string_view sv) {
                       if (needs_escape(cp)) {
                         result = {sv.begin(), sv.end(), cp};
                         return false;
                       }
                       return true;
                     });
  return result;
}